

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::FindModule(cmFindPackageCommand *this,bool *found)

{
  cmMakefile *this_00;
  char *pcVar1;
  ulong uVar2;
  undefined1 local_98 [7];
  bool result;
  string var;
  string mfile;
  allocator local_41;
  string local_40 [8];
  string module;
  bool *found_local;
  cmFindPackageCommand *this_local;
  
  module.field_2._8_8_ = found;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Find",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::operator+=(local_40,(string *)&this->Name);
  std::__cxx11::string::operator+=(local_40,".cmake");
  this_00 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  cmMakefile::GetModulesFile_abi_cxx11_((string *)((long)&var.field_2 + 8),this_00,pcVar1);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    *(undefined1 *)module.field_2._8_8_ = 1;
    std::__cxx11::string::string((string *)local_98,(string *)&this->Name);
    std::__cxx11::string::operator+=((string *)local_98,"_FIND_MODULE");
    cmMakefile::AddDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_98,"1");
    pcVar1 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ = ReadListFile(this,pcVar1,DoPolicyScope);
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
  }
  else {
    this_local._7_1_ = true;
  }
  std::__cxx11::string::~string((string *)(var.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool cmFindPackageCommand::FindModule(bool& found)
{
  std::string module = "Find";
  module += this->Name;
  module += ".cmake";
  std::string mfile = this->Makefile->GetModulesFile(module.c_str());
  if (!mfile.empty()) {
    // Load the module we found, and set "<name>_FIND_MODULE" to true
    // while inside it.
    found = true;
    std::string var = this->Name;
    var += "_FIND_MODULE";
    this->Makefile->AddDefinition(var, "1");
    bool result = this->ReadListFile(mfile.c_str(), DoPolicyScope);
    this->Makefile->RemoveDefinition(var);
    return result;
  }
  return true;
}